

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTruth.c
# Opt level: O3

int * Tru_ManLookup(Tru_Man_t *p,word *pTruth)

{
  uint *puVar1;
  uint uVar2;
  Vec_Set_t *pVVar3;
  uint uVar4;
  uint *puVar5;
  word *pwVar6;
  ulong uVar7;
  
  if ((*pTruth & 1) != 0) {
    __assert_fail("(pTruth[0] & 1) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satTruth.c"
                  ,0x62,"int *Tru_ManLookup(Tru_Man_t *, word *)");
  }
  uVar2 = p->nWords;
  if ((int)uVar2 < 1) {
    uVar4 = 0;
  }
  else {
    uVar7 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 ^ Tru_ManLookup::s_Primes[(uint)uVar7 & 7] * (int)pTruth[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  puVar1 = (uint *)(p->pTable + (ulong)uVar4 % (ulong)(uint)p->nTableSize);
  uVar4 = *puVar1;
  if (uVar4 != 0) {
    pVVar3 = p->pMem;
    if (pVVar3->pPages[(int)uVar4 >> ((byte)pVVar3->nPageSize & 0x1f)] != (word *)0x0) {
      pwVar6 = pVVar3->pPages[(int)uVar4 >> ((byte)pVVar3->nPageSize & 0x1f)] +
               (int)(pVVar3->uPageMask & uVar4);
      puVar5 = puVar1;
      while (0 < (int)uVar2) {
        uVar7 = 0;
        while (pwVar6[uVar7 + 1] == pTruth[uVar7]) {
          uVar7 = uVar7 + 1;
          if (uVar2 == uVar7) {
            return (int *)puVar5;
          }
        }
        uVar4 = *(uint *)((long)pwVar6 + 4);
        puVar5 = (uint *)((long)pwVar6 + 4);
        if (uVar4 == 0) {
          return (int *)puVar5;
        }
        pVVar3 = p->pMem;
        pwVar6 = pVVar3->pPages[(int)uVar4 >> ((byte)pVVar3->nPageSize & 0x1f)] +
                 (int)(pVVar3->uPageMask & uVar4);
        if (pVVar3->pPages[(int)uVar4 >> ((byte)pVVar3->nPageSize & 0x1f)] == (word *)0x0) {
          return (int *)puVar5;
        }
      }
    }
  }
  return (int *)puVar1;
}

Assistant:

int * Tru_ManLookup( Tru_Man_t * p, word * pTruth )
{
    static int s_Primes[10] = { 1291, 1699, 2357, 4177, 5147, 5647, 6343, 7103, 7873, 8147 };
    Tru_One_t * pEntry;
    int * pSpot;
    assert( (pTruth[0] & 1) == 0 );
    pSpot = p->pTable + Tru_ManHash( pTruth, p->nWords, p->nTableSize, s_Primes );
    for ( pEntry = Tru_ManReadOne(p, *pSpot); pEntry; pSpot = &pEntry->Next, pEntry = Tru_ManReadOne(p, *pSpot) )
        if ( Tru_ManEqual(pEntry->pTruth, pTruth, p->nWords) )
            return pSpot;
    return pSpot;
}